

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aspa.c
# Opt level: O0

void test_multiple_syncs(rtr_socket *socket)

{
  int iVar1;
  aspa_record *paVar2;
  int *piVar3;
  long in_FS_OFFSET;
  int aiStack_22b8 [2074];
  undefined8 uStack_250;
  aspa_record *local_248;
  int *local_240;
  ulong local_238;
  size_t c_ex;
  unsigned_long __vla_expr0;
  ulong local_220;
  size_t record_count;
  size_t i_1;
  uint32_t c_an;
  uint32_t c_wd;
  size_t i;
  undefined8 local_1f8;
  size_t N;
  size_t PROVIDER_COUNT;
  rtr_socket *socket_local;
  undefined8 local_1d8;
  uint32_t *local_1d0;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  int local_1a8;
  int local_1a4;
  int local_1a0;
  int local_19c;
  undefined1 local_198 [8];
  update_callback _callbacks850 [3];
  uint32_t local_118;
  int local_114;
  int local_110;
  int local_10c;
  uint32_t local_108;
  int local_104;
  int local_100;
  int local_fc;
  undefined4 local_f8;
  undefined4 local_f4;
  undefined4 local_f0;
  undefined4 local_ec;
  undefined4 local_e8;
  undefined4 local_e4;
  undefined4 local_e0;
  undefined4 local_dc;
  undefined1 local_d8 [8];
  aspa_record _records821 [2];
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined1 local_88 [8];
  update_callback _callbacks813 [2];
  uint32_t local_30 [8];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  N = 4;
  local_1f8 = 0x104;
  uStack_250 = 0x107911;
  PROVIDER_COUNT = (size_t)socket;
  begin_cache_response('\x02',0);
  local_30[4] = 2;
  local_30[5] = 3;
  local_30[6] = 4;
  local_30[7] = 5;
  uStack_250 = 0x107948;
  append_aspa('\x02','\x01',1,local_30 + 4,4);
  local_30[0] = 3;
  local_30[1] = 4;
  local_30[2] = 5;
  local_30[3] = 6;
  uStack_250 = 0x10797f;
  append_aspa('\x02','\x01',2,local_30,4);
  uStack_250 = 0x107990;
  end_cache_response('\x02',0,0x1b5);
  local_88 = (undefined1  [8])0x0;
  _callbacks813[0].source._0_4_ = 1;
  _callbacks813[0].record.customer_asn = 4;
  _callbacks813[0].record._4_4_ = 0;
  local_98 = 2;
  local_94 = 3;
  local_90 = 4;
  local_8c = 5;
  _callbacks813[0].record.provider_count = (size_t)&local_98;
  _callbacks813[0].record.provider_asns._0_1_ = 1;
  _callbacks813[0].type = ASPA_REMOVE;
  _callbacks813[0]._33_7_ = 0;
  _callbacks813[1].source._0_4_ = 2;
  _callbacks813[1].record.customer_asn = 4;
  _callbacks813[1].record._4_4_ = 0;
  _records821[1].provider_asns._0_4_ = 3;
  _records821[1].provider_asns._4_4_ = 4;
  _callbacks813[1].record.provider_count = (size_t)&_records821[1].provider_asns;
  _callbacks813[1].record.provider_asns._0_1_ = 1;
  uStack_250 = 0x107a3a;
  expect_update_callbacks((update_callback *)local_88,2);
  uStack_250 = 0x107a46;
  iVar1 = rtr_sync((rtr_socket *)PROVIDER_COUNT);
  if (iVar1 != 0) {
    uStack_250 = 0x107a6c;
    __assert_fail("rtr_sync(socket) == RTR_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                  ,0x32f,"void test_multiple_syncs(struct rtr_socket *)");
  }
  if (callback_index == callback_count) {
    local_d8._0_4_ = 1;
    _records821[0].customer_asn = 4;
    _records821[0]._4_4_ = 0;
    local_e8 = 2;
    local_e4 = 3;
    local_e0 = 4;
    local_dc = 5;
    _records821[0].provider_count = (size_t)&local_e8;
    _records821[0].provider_asns._0_4_ = 2;
    _records821[1].customer_asn = 4;
    _records821[1]._4_4_ = 0;
    local_f8 = 3;
    local_f4 = 4;
    local_f0 = 5;
    local_ec = 6;
    _records821[1].provider_count = (size_t)&local_f8;
    uStack_250 = 0x107b4b;
    assert_table((rtr_socket *)PROVIDER_COUNT,(aspa_record *)local_d8,2);
    local_240 = aiStack_22b8;
    for (_c_an = 0; _c_an < 4; _c_an = _c_an + 1) {
      local_240[_c_an] = (int)_c_an + 3;
    }
    i_1._4_4_ = 1;
    piVar3 = local_240;
    i = (size_t)&local_248;
    while( true ) {
      if (0x103 < i_1._4_4_) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
          return;
        }
        *(undefined8 *)(i - 8) = 0x108091;
        __stack_chk_fail();
      }
      i_1._0_4_ = i_1._4_4_ * 2 + 1;
      piVar3[-2] = 0x107be8;
      piVar3[-1] = 0;
      begin_cache_response('\x02',0);
      piVar3[-2] = 0x107c02;
      piVar3[-1] = 0;
      append_aspa('\x02','\0',i_1._4_4_,(uint32_t *)0x0,0);
      local_108 = (uint32_t)i_1 + 1;
      local_104 = (uint32_t)i_1 + 2;
      local_100 = (uint32_t)i_1 + 3;
      local_fc = (uint32_t)i_1 + 4;
      piVar3[-2] = 0x107c60;
      piVar3[-1] = 0;
      append_aspa('\x02','\x01',(uint32_t)i_1,&local_108,4);
      local_118 = (uint32_t)i_1 + 2;
      local_114 = (uint32_t)i_1 + 3;
      local_110 = (uint32_t)i_1 + 4;
      local_10c = (uint32_t)i_1 + 5;
      piVar3[-2] = 0x107cc1;
      piVar3[-1] = 0;
      append_aspa('\x02','\x01',(uint32_t)i_1 + 1,&local_118,4);
      piVar3[-2] = 0x107cd2;
      piVar3[-1] = 0;
      end_cache_response('\x02',0,0x1bc);
      local_198 = (undefined1  [8])0x0;
      _callbacks850[0].source._0_4_ = i_1._4_4_;
      _callbacks850[0].record.customer_asn = 4;
      _callbacks850[0].record._4_4_ = 0;
      local_1a8 = i_1._4_4_ + 1;
      local_1a4 = i_1._4_4_ + 2;
      local_1a0 = i_1._4_4_ + 3;
      local_19c = i_1._4_4_ + 4;
      _callbacks850[0].record.provider_count = (size_t)&local_1a8;
      _callbacks850[0].record.provider_asns._0_1_ = 0;
      _callbacks850[0].type = ASPA_REMOVE;
      _callbacks850[0]._33_7_ = 0;
      _callbacks850[1].source._0_4_ = (uint32_t)i_1;
      _callbacks850[1].record.customer_asn = 4;
      _callbacks850[1].record._4_4_ = 0;
      local_1b8 = (uint32_t)i_1 + 1;
      local_1b4 = (uint32_t)i_1 + 2;
      local_1b0 = (uint32_t)i_1 + 3;
      local_1ac = (uint32_t)i_1 + 4;
      _callbacks850[1].record.provider_count = (size_t)&local_1b8;
      _callbacks850[1].record.provider_asns._0_1_ = 1;
      _callbacks850[1].type = ASPA_REMOVE;
      _callbacks850[1]._33_7_ = 0;
      _callbacks850[2].source._0_4_ = (uint32_t)i_1 + 1;
      _callbacks850[2].record.customer_asn = 4;
      _callbacks850[2].record._4_4_ = 0;
      local_1c8 = (uint32_t)i_1 + 2;
      local_1c4 = (uint32_t)i_1 + 3;
      local_1c0 = (uint32_t)i_1 + 4;
      local_1bc = (uint32_t)i_1 + 5;
      _callbacks850[2].record.provider_count = (size_t)&local_1c8;
      _callbacks850[2].record.provider_asns._0_1_ = 1;
      piVar3[-2] = 0x107e3f;
      piVar3[-1] = 0;
      expect_update_callbacks((update_callback *)local_198,3);
      piVar3[-2] = 0x107e4b;
      piVar3[-1] = 0;
      iVar1 = rtr_sync((rtr_socket *)PROVIDER_COUNT);
      if (iVar1 != 0) break;
      if (callback_index != callback_count) {
        piVar3[-2] = 0x107ea2;
        piVar3[-1] = 0;
        __assert_fail("callback_index == callback_count",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                      ,0x354,"void test_multiple_syncs(struct rtr_socket *)");
      }
      for (record_count = 0; record_count < 4; record_count = record_count + 1) {
        local_240[(ulong)((uint32_t)i_1 - 2) * 4 + record_count] =
             (uint32_t)i_1 + (int)record_count + 1;
        local_240[(ulong)((uint32_t)i_1 - 1) * 4 + record_count] =
             (uint32_t)i_1 + (int)record_count + 2;
      }
      c_ex = (size_t)(i_1._4_4_ + 2);
      local_248 = (aspa_record *)((long)piVar3 - (c_ex * 0x18 + 0xf & 0xfffffffffffffff0));
      for (local_238 = (ulong)(i_1._4_4_ + 1); local_238 <= (uint32_t)i_1 + 1;
          local_238 = local_238 + 1) {
        paVar2 = local_248 + (local_238 - (i_1._4_4_ + 1));
        socket_local._0_4_ = (undefined4)local_238;
        local_1d8 = 4;
        local_1d0 = (uint32_t *)(local_240 + (local_238 - 2) * 4);
        *(ulong *)paVar2 = CONCAT44(socket_local._4_4_,socket_local._0_4_);
        paVar2->provider_count = 4;
        paVar2->provider_asns = local_1d0;
      }
      local_248[-1].provider_asns = (uint32_t *)0x10804d;
      __vla_expr0 = (unsigned_long)piVar3;
      local_220 = c_ex;
      assert_table((rtr_socket *)PROVIDER_COUNT,local_248,c_ex);
      i_1._4_4_ = i_1._4_4_ + 1;
      piVar3 = (int *)__vla_expr0;
    }
    piVar3[-2] = 0x107e71;
    piVar3[-1] = 0;
    __assert_fail("rtr_sync(socket) == RTR_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                  ,0x353,"void test_multiple_syncs(struct rtr_socket *)");
  }
  uStack_250 = 0x107a9d;
  __assert_fail("callback_index == callback_count",
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                ,0x330,"void test_multiple_syncs(struct rtr_socket *)");
}

Assistant:

static void test_multiple_syncs(struct rtr_socket *socket)
{
	const size_t PROVIDER_COUNT = 4;
	// amount of ASPAs to be withdrawn (twice as much are added)
	const size_t N = 256 + 4;

	// initial cycle: add two new aspas
	begin_cache_response(RTR_PROTOCOL_VERSION_2, 0);
	APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_ANNOUNCE, 1, ASNS(2, 3, 4, 5));
	APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_ANNOUNCE, 2, ASNS(3, 4, 5, 6));
	end_cache_response(RTR_PROTOCOL_VERSION_2, 0, 437);

	EXPECT_UPDATE_CALLBACKS(
		ADDED(RECORD(1, ASNS(2, 3, 4, 5))),
		ADDED(RECORD(2, ASNS(3, 4, 5, 6))),
	);

	assert(rtr_sync(socket) == RTR_SUCCESS);
	assert(callback_index == callback_count);

	ASSERT_TABLE(socket,
		RECORD(1, ASNS(2, 3, 4, 5)),
		RECORD(2, ASNS(3, 4, 5, 6)),
	);

	// repeated cycle: withdraw one, announce two new
	// store expected provider asns, starting with providers for c_an = 2
	uint32_t provider_asns[(2 * N - 1) * PROVIDER_COUNT];

	// enter provider_asns for ASPA record 2 => {3, 4, 5, 6}
	for (size_t i = 0; i < PROVIDER_COUNT; i++)
		provider_asns[i] = i + 3;

	// customer asn to be withdrawn
	for (uint32_t c_wd = 1; c_wd < N; c_wd++) {
		// first customer asn to be announced
		uint32_t c_an = 2 * c_wd + 1;

		begin_cache_response(RTR_PROTOCOL_VERSION_2, 0);
		APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_WITHDRAW, c_wd,
			ASNS());
		APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_ANNOUNCE, c_an,
			ASNS(c_an + 1, c_an + 2, c_an + 3, c_an + 4));
		APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_ANNOUNCE, c_an + 1,
			ASNS(c_an + 2, c_an + 3, c_an + 4, c_an + 5));

		end_cache_response(RTR_PROTOCOL_VERSION_2, 0, 444);

		EXPECT_UPDATE_CALLBACKS(
			REMOVED(RECORD(c_wd, ASNS(c_wd + 1, c_wd + 2, c_wd + 3, c_wd + 4))),
			ADDED(RECORD(c_an, ASNS(c_an + 1, c_an + 2, c_an + 3, c_an + 4))),
			ADDED(RECORD(c_an + 1, ASNS(c_an + 2, c_an + 3, c_an + 4, c_an + 5))),
		);
		assert(rtr_sync(socket) == RTR_SUCCESS);
		assert(callback_index == callback_count);

		// store announced ASPAs' providers for validation
		for (size_t i = 0; i < PROVIDER_COUNT; i++) {
			provider_asns[PROVIDER_COUNT * (size_t)(c_an - 2) + i] = c_an + (uint32_t)i + 1;
			provider_asns[PROVIDER_COUNT * (size_t)(c_an - 1) + i] = c_an + (uint32_t)i + 2;
		}

		// build array of all records expected to be in aspa_table
		// (customer asns after last withdrawn until including last announced)
		size_t record_count = c_wd + 2;
		struct aspa_record records[record_count];

		for (size_t c_ex = c_wd + 1; c_ex <= c_an + 1; c_ex++) {
			records[c_ex - (c_wd + 1)] =
				((struct aspa_record) {
					.customer_asn = (uint32_t)c_ex,
					.provider_count = PROVIDER_COUNT,
					.provider_asns = &provider_asns[PROVIDER_COUNT * (c_ex - 2)]
				});
		}
		assert_table(socket, records, record_count);
	}
}